

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

ikey_type<unodb::olc_db<std::uint64_t,_unodb::value_view>_> __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
to_ikey(tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
        *this,key_type key)

{
  return key;
}

Assistant:

[[nodiscard]] ikey_type<Db> to_ikey(typename Db::key_type key) const
      noexcept(!std::is_same_v<key_type, unodb::key_view>) {
    if constexpr (std::is_same_v<key_type, unodb::key_view>) {
      // Allocate a vector, make a copy of the key into the vector,
      // and return a shared_ptr to that vector.
      UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
      return std::make_shared<std::vector<std::byte>>(key.begin(), key.end());
    } else {
      return key;  // NOP
    }
  }